

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

Result * __thiscall Catch::Clara::Opt::validate(Opt *this)

{
  bool bVar1;
  char cVar2;
  long in_RSI;
  Result *in_RDI;
  StringRef *name;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *__range2;
  string *in_stack_ffffffffffffff18;
  string *message;
  __normal_iterator<const_Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
  *in_stack_ffffffffffffff20;
  allocator<char> local_b1;
  allocator<char> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  allocator<char> local_89;
  string local_88 [32];
  StringRef *local_68;
  StringRef *local_60;
  __normal_iterator<const_Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
  local_58;
  long local_50;
  allocator<char> local_31;
  string local_30 [48];
  
  bVar1 = std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::empty
                    ((vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *)in_RDI);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    Detail::BasicResult<void>::logicError(in_stack_ffffffffffffff18);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator(&local_31);
  }
  else {
    local_50 = in_RSI + 0x40;
    local_58._M_current =
         (StringRef *)
         std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::begin
                   ((vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *)
                    in_stack_ffffffffffffff18);
    local_60 = (StringRef *)
               std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::end
                         ((vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *)
                          in_stack_ffffffffffffff18);
    while (bVar1 = __gnu_cxx::operator!=
                             (in_stack_ffffffffffffff20,
                              (__normal_iterator<const_Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
                               *)in_stack_ffffffffffffff18), bVar1) {
      local_68 = __gnu_cxx::
                 __normal_iterator<const_Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
                 ::operator*(&local_58);
      bVar1 = StringRef::empty(local_68);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
        Detail::BasicResult<void>::logicError(in_stack_ffffffffffffff18);
        std::__cxx11::string::~string(local_88);
        std::allocator<char>::~allocator(&local_89);
        return in_RDI;
      }
      cVar2 = StringRef::operator[](local_68,0);
      if (cVar2 != '-') {
        message = (string *)&local_b1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
        Detail::BasicResult<void>::logicError(message);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
        std::allocator<char>::~allocator(&local_b1);
        return in_RDI;
      }
      __gnu_cxx::
      __normal_iterator<const_Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
      ::operator++(&local_58);
    }
    Detail::ParserBase::validate((ParserBase *)in_stack_ffffffffffffff18);
  }
  return in_RDI;
}

Assistant:

Detail::Result Opt::validate() const {
            if (m_optNames.empty())
                return Detail::Result::logicError("No options supplied to Opt");
            for (auto const& name : m_optNames) {
                if (name.empty())
                    return Detail::Result::logicError(
                        "Option name cannot be empty");
#ifdef CATCH_PLATFORM_WINDOWS
                if (name[0] != '-' && name[0] != '/')
                    return Detail::Result::logicError(
                        "Option name must begin with '-' or '/'");
#else
                if (name[0] != '-')
                    return Detail::Result::logicError(
                        "Option name must begin with '-'");
#endif
            }
            return ParserRefImpl::validate();
        }